

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int doputon(obj *otmp)

{
  short sVar1;
  short sVar2;
  boolean bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *line;
  long mask;
  char qbuf [128];
  char acStack_b8 [136];
  
  if (otmp == (obj *)0x0) {
    otmp = getobj("\x03\x04\x05\x06\a","put on",(obj **)0x0);
    if (otmp == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar3 = validate_object(otmp,"\x03\x04\x05\x06\a","put on");
    if (bVar3 == '\0') {
      return 0;
    }
  }
  if (otmp->oclass == '\x03') {
    iVar5 = dowear(otmp);
    return iVar5;
  }
  if ((otmp->owornmask & 0xf0000) != 0) {
    pcVar9 = "that";
    uVar7 = 0x21;
    goto LAB_00187415;
  }
  iVar5 = welded(otmp);
  if (iVar5 != 0) {
    weldmsg(otmp);
    return 0;
  }
  if (otmp == uwep) {
    setuwep((obj *)0x0);
  }
  if (otmp == uswapwep) {
    setuswapwep((obj *)0x0);
  }
  if (otmp == uquiver) {
    setuqwep((obj *)0x0);
  }
  if ((otmp->oclass != '\x04') && (sVar1 = otmp->otyp, sVar1 != 0x113)) {
    if (otmp->oclass == '\x05') {
      if (uamul == (obj *)0x0) {
        if ((otmp->oartifact != '\0') && (iVar5 = touch_artifact(otmp,&youmonst), iVar5 == 0)) {
          return 1;
        }
        setworn(otmp,0x10000);
        Amulet_on();
        return 1;
      }
      pcVar9 = "an amulet";
    }
    else {
      if (ublindf == (obj *)0x0) {
        if ((ushort)(sVar1 - 0xedU) < 3) {
          if ((otmp->oartifact != '\0') && (iVar5 = touch_artifact(otmp,&youmonst), iVar5 == 0)) {
            return 1;
          }
          Blindf_on(otmp);
          return 1;
        }
        pcVar9 = "You can\'t wear that!";
        goto LAB_001874bd;
      }
      sVar2 = ublindf->otyp;
      if (sVar2 == 0xed) {
        if (sVar1 == 0xee) {
          pcVar8 = "a blindfold";
          pcVar9 = "some lenses";
LAB_00187821:
          line = "You can\'t wear %s because you\'re wearing %s there already.";
LAB_00187533:
          pline(line,pcVar8,pcVar9);
          return 0;
        }
        pcVar9 = "some lenses";
      }
      else if (sVar2 == 0xee) {
        if (sVar1 == 0xed) {
          pcVar8 = "lenses";
          pcVar9 = "a blindfold";
          goto LAB_00187821;
        }
        pcVar9 = "a blindfold";
      }
      else {
        if (sVar2 == 0xef) {
          pcVar9 = body_part(2);
          pline("Your %s is already covered by a towel.",pcVar9);
          return 0;
        }
        pcVar9 = "something";
      }
    }
    uVar7 = 0x2e;
    if (pcVar9 == "that") {
      uVar7 = 0x21;
    }
LAB_00187415:
    pline("You are already wearing %s%c",pcVar9,uVar7);
    return 0;
  }
  uVar6 = (youmonst.data)->mflags1;
  if ((~uVar6 & 0x6000) == 0) {
    pcVar9 = "You cannot make the ring stick to your body.";
    goto LAB_001874bd;
  }
  if (uright != (obj *)0x0 && uleft != (obj *)0x0) {
    pcVar8 = "ring-";
    if ((uVar6 >> 0x11 & 1) == 0) {
      pcVar8 = "";
    }
    pcVar9 = body_part(3);
    pcVar9 = makeplural(pcVar9);
    line = "There are no more %s%s to fill.";
    goto LAB_00187533;
  }
  if (uright == (obj *)0x0 && uleft == (obj *)0x0) {
    do {
      pcVar9 = "";
      if ((uVar6 >> 0x11 & 1) != 0) {
        pcVar9 = "ring-";
      }
      pcVar8 = body_part(3);
      sprintf(acStack_b8,"Which %s%s, Right or Left?",pcVar9,pcVar8);
      bVar4 = yn_function(acStack_b8,"rl",'\0');
      if (bVar4 < 0x52) {
        if (bVar4 == 0) {
          return 0;
        }
        if (bVar4 == 0x4c) goto LAB_001876fe;
      }
      else {
        if (bVar4 == 0x52) goto LAB_001876f6;
        if (bVar4 == 0x6c) {
LAB_001876fe:
          mask = 0x20000;
          goto LAB_00187704;
        }
        if (bVar4 == 0x72) goto LAB_001876f6;
      }
      uVar6 = (youmonst.data)->mflags1;
    } while( true );
  }
  mask = (ulong)(uleft != (obj *)0x0) * 0x20000 + 0x20000;
LAB_00187704:
  if ((uarmg == (obj *)0x0) || ((*(uint *)&uarmg->field_0x4a & 1) == 0)) {
    iVar5 = welded(uwep);
    if ((iVar5 == 0) ||
       (((byte)(uwep->oclass | 4U) != 6 || ((objects[uwep->otyp].field_0x11 & 1) == 0)))) {
      iVar5 = welded(uwep);
      if (((int)mask != 0x40000) || (iVar5 == 0)) {
        if ((otmp->oartifact != '\0') && (iVar5 = touch_artifact(otmp,&youmonst), iVar5 == 0)) {
          return 1;
        }
        setworn(otmp,mask);
        Ring_on(otmp,'\x01');
        return 1;
      }
      pcVar9 = "You cannot free your weapon hand to put on the ring.";
    }
    else {
      pcVar9 = "You cannot free your weapon hands to put on the ring.";
    }
  }
  else {
    *(uint *)&uarmg->field_0x4a = *(uint *)&uarmg->field_0x4a | 0x40;
    pcVar9 = "You cannot remove your gloves to put on the ring.";
  }
LAB_001874bd:
  pline(pcVar9);
  return 0;
LAB_001876f6:
  mask = 0x40000;
  goto LAB_00187704;
}

Assistant:

int doputon(struct obj *otmp)
{
	long mask = 0L;

	if (otmp && !validate_object(otmp, clothes_and_accessories, "put on"))
		return 0;
	else if (!otmp)
		otmp = getobj(clothes_and_accessories, "put on", NULL);
	if (!otmp) return 0;
        if (otmp->oclass == ARMOR_CLASS) return dowear(otmp);

	if (otmp->owornmask & (W_RING | W_AMUL | W_TOOL)) {
		already_wearing(c_that_);
		return 0;
	}
	if (welded(otmp)) {
		weldmsg(otmp);
		return 0;
	}
	if (otmp == uwep)
		setuwep(NULL);
	if (otmp == uswapwep)
		setuswapwep(NULL);
	if (otmp == uquiver)
		setuqwep(NULL);
	if (otmp->oclass == RING_CLASS || otmp->otyp == MEAT_RING) {
		if (nolimbs(youmonst.data)) {
			pline("You cannot make the ring stick to your body.");
			return 0;
		}
		if (uleft && uright){
			pline("There are no more %s%s to fill.",
				humanoid(youmonst.data) ? "ring-" : "",
				makeplural(body_part(FINGER)));
			return 0;
		}
		if (uleft) mask = RIGHT_RING;
		else if (uright) mask = LEFT_RING;
		else do {
			char qbuf[QBUFSZ];
			char answer;

			sprintf(qbuf, "Which %s%s, Right or Left?",
				humanoid(youmonst.data) ? "ring-" : "",
				body_part(FINGER));
			if (!(answer = yn_function(qbuf, "rl", '\0')))
				return 0;
			switch(answer){
			case 'l':
			case 'L':
				mask = LEFT_RING;
				break;
			case 'r':
			case 'R':
				mask = RIGHT_RING;
				break;
			}
		} while (!mask);
		if (uarmg && uarmg->cursed) {
			uarmg->bknown = TRUE;
		    pline("You cannot remove your gloves to put on the ring.");
			return 0;
		}
		if (welded(uwep) && bimanual(uwep)) {
			/* welded will set bknown */
	    pline("You cannot free your weapon hands to put on the ring.");
			return 0;
		}
		if (welded(uwep) && mask==RIGHT_RING) {
			/* welded will set bknown */
	    pline("You cannot free your weapon hand to put on the ring.");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1; /* costs a turn even though it didn't get worn */
		setworn(otmp, mask);
		Ring_on(otmp, TRUE);
	} else if (otmp->oclass == AMULET_CLASS) {
		if (uamul) {
			already_wearing("an amulet");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1;
		setworn(otmp, W_AMUL);
		if (otmp->otyp == AMULET_OF_CHANGE) {
			Amulet_on();
			/* Don't do a prinv() since the amulet is now gone */
			return 1;
		}
		Amulet_on();
	} else {	/* it's a blindfold, towel, or lenses */
		if (ublindf) {
			if (ublindf->otyp == TOWEL)
				pline("Your %s is already covered by a towel.",
					body_part(FACE));
			else if (ublindf->otyp == BLINDFOLD) {
				if (otmp->otyp == LENSES)
					already_wearing2("lenses", "a blindfold");
				else
					already_wearing("a blindfold");
			} else if (ublindf->otyp == LENSES) {
				if (otmp->otyp == BLINDFOLD)
					already_wearing2("a blindfold", "some lenses");
				else
					already_wearing("some lenses");
			} else
				already_wearing("something"); /* ??? */
			return 0;
		}
		if (otmp->otyp != BLINDFOLD && otmp->otyp != TOWEL && otmp->otyp != LENSES) {
			pline("You can't wear that!");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1;
		Blindf_on(otmp);
		return 1;
	}
	return 1;
}